

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O1

void __thiscall
Am_Priority_List::insert_item_at_right_place(Am_Priority_List *this,Am_Priority_List_Item *item)

{
  float fVar1;
  float fVar2;
  Am_Priority_List_Item *pAVar3;
  Am_Priority_List_Item *pAVar4;
  Am_Priority_List_Item **ppAVar5;
  
  pAVar4 = this->head;
  if (pAVar4 == (Am_Priority_List_Item *)0x0) {
    this->head = item;
    this->tail = item;
    item->next = (Am_Priority_List_Item *)0x0;
    item->prev = (Am_Priority_List_Item *)0x0;
    return;
  }
  fVar1 = item->main_priority;
  while ((fVar2 = pAVar4->main_priority, fVar1 <= fVar2 &&
         (((fVar2 != fVar1 || (NAN(fVar2) || NAN(fVar1))) ||
          ((item->second_priority <= pAVar4->second_priority &&
           ((pAVar4->second_priority != item->second_priority ||
            (item->third_priority < pAVar4->third_priority))))))))) {
    pAVar4 = pAVar4->next;
    if (pAVar4 == (Am_Priority_List_Item *)0x0) {
      item->next = (Am_Priority_List_Item *)0x0;
      pAVar4 = this->tail;
      item->prev = pAVar4;
      pAVar4->next = item;
      this->tail = item;
      return;
    }
  }
  pAVar3 = pAVar4->prev;
  ppAVar5 = &pAVar3->next;
  if (pAVar3 == (Am_Priority_List_Item *)0x0) {
    ppAVar5 = &this->head;
  }
  *ppAVar5 = item;
  item->prev = pAVar3;
  item->next = pAVar4;
  pAVar4->prev = item;
  return;
}

Assistant:

void
Am_Priority_List::insert_item_at_right_place(Am_Priority_List_Item *item)
{
  Am_Priority_List_Item *p = head;
  if (!p) { // list is empty
    head = item;
    tail = item;
    item->next = nullptr;
    item->prev = nullptr;
  } else { // search for place
    float my_main_priority = item->main_priority;
    int my_second_priority = item->second_priority;
    int my_third_priority = item->third_priority;
    for (; p != nullptr; p = p->next) {
      if (p->main_priority < my_main_priority ||
          (p->main_priority == my_main_priority &&
           (p->second_priority < my_second_priority ||
            (p->second_priority == my_second_priority &&
             p->third_priority <= my_third_priority)))) {
        // then put item before p
        if (p->prev) {
          p->prev->next = item;
          item->prev = p->prev;
        } else { // p is the first in list
          head = item;
          item->prev = nullptr;
        }
        item->next = p;
        p->prev = item;
        return;
      }
    } // end for
    //if get here, then item should go last in the list
    item->next = nullptr;
    item->prev = tail;
    tail->next = item;
    tail = item;
  }
}